

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pstd.h
# Opt level: O0

void __thiscall
pstd::
vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>::
reserve(vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
        *this,size_t n)

{
  PiecewiseConstant1D *pPVar1;
  ulong in_RSI;
  vector<pbrt::PiecewiseConstant1D,_pstd::pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>_>
  *in_RDI;
  int i;
  PiecewiseConstant1D *ra;
  PiecewiseConstant1D *in_stack_ffffffffffffffc8;
  PiecewiseConstant1D *in_stack_ffffffffffffffd0;
  int local_1c;
  
  if (in_RDI->nAlloc < in_RSI) {
    pPVar1 = pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::
             allocate_object<pbrt::PiecewiseConstant1D>
                       ((polymorphic_allocator<pbrt::PiecewiseConstant1D> *)
                        in_stack_ffffffffffffffd0,(size_t)in_stack_ffffffffffffffc8);
    for (local_1c = 0; (ulong)(long)local_1c < in_RDI->nStored; local_1c = local_1c + 1) {
      in_stack_ffffffffffffffd0 = pPVar1 + local_1c;
      begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::
      construct<pbrt::PiecewiseConstant1D,pbrt::PiecewiseConstant1D>
                ((polymorphic_allocator<pbrt::PiecewiseConstant1D> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8,(PiecewiseConstant1D *)0x5b7682);
      begin(in_RDI);
      pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::destroy<pbrt::PiecewiseConstant1D>
                ((polymorphic_allocator<pbrt::PiecewiseConstant1D> *)in_stack_ffffffffffffffd0,
                 in_stack_ffffffffffffffc8);
    }
    pmr::polymorphic_allocator<pbrt::PiecewiseConstant1D>::
    deallocate_object<pbrt::PiecewiseConstant1D>
              ((polymorphic_allocator<pbrt::PiecewiseConstant1D> *)in_stack_ffffffffffffffd0,
               in_stack_ffffffffffffffc8,0x5b76c4);
    in_RDI->nAlloc = in_RSI;
    in_RDI->ptr = pPVar1;
  }
  return;
}

Assistant:

void reserve(size_t n) {
        if (nAlloc >= n)
            return;

        T *ra = alloc.template allocate_object<T>(n);
        for (int i = 0; i < nStored; ++i) {
            alloc.template construct<T>(ra + i, std::move(begin()[i]));
            alloc.destroy(begin() + i);
        }

        alloc.deallocate_object(ptr, nAlloc);
        nAlloc = n;
        ptr = ra;
    }